

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlSetUniformSampler(int locIndex,uint textureId)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  long lVar3;
  
  if (RLGL.State.activeTextureId[0] == textureId) {
    (*glad_glUniform1i)(locIndex,1);
    return;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 3) goto LAB_0011b5d2;
    uVar1 = uVar2 + 1;
  } while (RLGL.State.activeTextureId[uVar2 + 1] != textureId);
  (*glad_glUniform1i)(locIndex,(int)(uVar2 + 1) + 1);
  if (2 < uVar2) {
LAB_0011b5d2:
    lVar3 = 0;
    do {
      if (RLGL.State.activeTextureId[lVar3] == 0) {
        (*glad_glUniform1i)(locIndex,(int)lVar3 + 1);
        RLGL.State.activeTextureId[lVar3] = textureId;
        return;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  return;
}

Assistant:

void rlSetUniformSampler(int locIndex, unsigned int textureId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Check if texture is already active
    for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++)
    {
        if (RLGL.State.activeTextureId[i] == textureId)
        {
            glUniform1i(locIndex, 1 + i);
            return;
        }
    }

    // Register a new active texture for the internal batch system
    // NOTE: Default texture is always activated as GL_TEXTURE0
    for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++)
    {
        if (RLGL.State.activeTextureId[i] == 0)
        {
            glUniform1i(locIndex, 1 + i);              // Activate new texture unit
            RLGL.State.activeTextureId[i] = textureId; // Save texture id for binding on drawing
            break;
        }
    }
#endif
}